

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2.cpp
# Opt level: O2

UBool unorm2_isNormalized_63(UNormalizer2 *norm2,UChar *s,int32_t length,UErrorCode *pErrorCode)

{
  UBool UVar1;
  UnicodeString sString;
  ConstChar16Ptr local_68;
  UChar *local_60;
  UnicodeString local_50;
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((-2 < length) && (s != (UChar *)0x0 || length == 0)) {
      local_68.p_ = s;
      icu_63::UnicodeString::UnicodeString(&local_50,(byte)((uint)length >> 0x1f),&local_68,length);
      local_60 = local_68.p_;
      UVar1 = (**(code **)(*(long *)norm2 + 0x58))(norm2,&local_50,pErrorCode);
      icu_63::UnicodeString::~UnicodeString(&local_50);
      return UVar1;
    }
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return '\0';
}

Assistant:

U_CAPI UBool U_EXPORT2
unorm2_isNormalized(const UNormalizer2 *norm2,
                    const UChar *s, int32_t length,
                    UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if((s==NULL && length!=0) || length<-1) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    UnicodeString sString(length<0, s, length);
    return ((const Normalizer2 *)norm2)->isNormalized(sString, *pErrorCode);
}